

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<int> tcb::operator/(rational<char> *lhs,rational<char> *rhs)

{
  rational<int> rVar1;
  rational<int> local_10;
  
  local_10.num_ = (int)rhs->denom_ * (int)lhs->num_;
  local_10.denom_ = (int)rhs->num_ * (int)lhs->denom_;
  rational<int>::simplify(&local_10);
  rVar1.denom_ = local_10.denom_;
  rVar1.num_ = local_10.num_;
  return rVar1;
}

Assistant:

constexpr value_type num() const { return num_; }